

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void SortSetHelper(StringItem *list,Var item,uint32 index,JsReentLock *jsReentLock,
                  ScriptContext *scriptContext)

{
  Type TVar1;
  JavascriptString *pJVar2;
  StringItem *addr;
  Type *addr_00;
  Type TStack_68;
  StringItem current;
  JsReentLock lock;
  
  TStack_68.ptr = (void *)0x0;
  current.Value.ptr = (void *)0x0;
  Memory::Recycler::WBSetBit((char *)&TStack_68);
  TStack_68.ptr = item;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&TStack_68);
  current.StringValue.ptr = (JavascriptString *)jsReentLock->m_threadContext;
  lock.m_arrayObject2._0_1_ = SUB81(*(undefined8 *)&jsReentLock->m_savedNoJsReentrancy,0);
  ((ThreadContext *)current.StringValue.ptr)->noJsReentrancy = lock.m_arrayObject2._0_1_;
  pJVar2 = Js::JavascriptConversion::ToString(item,scriptContext);
  Memory::Recycler::WBSetBit((char *)&current);
  current.Value.ptr = pJVar2;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&current);
  JsReentLock::MutateArrayObject((JsReentLock *)&current.StringValue);
  TVar1.ptr = TStack_68.ptr;
  *(undefined1 *)&current.StringValue.ptr[8].super_RecyclableObject.type.ptr = 1;
  addr = list + index;
  Memory::Recycler::WBSetBit((char *)addr);
  (addr->Value).ptr = TVar1.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  TVar1 = current.Value;
  addr_00 = &addr->StringValue;
  Memory::Recycler::WBSetBit((char *)addr_00);
  addr_00->ptr = (JavascriptString *)TVar1.ptr;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
  *(bool *)&current.StringValue.ptr[8].super_RecyclableObject.type.ptr = lock.m_arrayObject2._0_1_;
  return;
}

Assistant:

inline void SortSetHelper(StringItem* list, Var item, uint32 index, JsReentLock* jsReentLock, ScriptContext* scriptContext)
    {
        StringItem current;
        current.Value = item;
        JsReentLock lock = *jsReentLock;
        JS_REENTRANT(lock, current.StringValue = JavascriptConversion::ToString(item, scriptContext));
        list[index] = current;
    }